

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsConvertValueToString(JsValueRef value,JsValueRef *result)

{
  ScriptContext *pSVar1;
  ScriptContext *pSVar2;
  bool bVar3;
  JsrtContext *pJVar4;
  RecyclableObject *pRVar5;
  JavascriptString *pJVar6;
  TTDJsRTActionResultAutoRecorder *this;
  ScriptContext *__localScriptContext;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_68 [8];
  EnterScriptObject __enterScriptObject;
  TTDJsRTActionResultAutoRecorder local_38;
  AutoNestedHandledExceptionType local_24 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  
  if (result == (JsValueRef *)0x0) {
    return JsErrorNullArgument;
  }
  *result = (JsValueRef)0x0;
  if ((value == (JsValueRef)0x0) || (bVar3 = Js::VarIs<Js::JavascriptString>(value), !bVar3)) {
    local_38.m_actionEvent = (EventLogEntry *)0x0;
    local_38.m_resultPtr = (TTDVar *)0x0;
    pJVar4 = JsrtContext::GetCurrent();
    if (pJVar4 == (JsrtContext *)0x0) {
      exitStatus = JsErrorNoCurrentContext;
    }
    else {
      pSVar1 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_24,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      auStack_a8 = (undefined1  [8])0x0;
      ___autoNestedHandledExceptionType = (void *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)auStack_68,pSVar1,(ScriptEntryExitRecord *)auStack_a8,
                 unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(pSVar1,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)auStack_68);
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTVarToStringConversion
                  (pSVar1->threadContext->TTDLog,&local_38,value);
      }
      if (value == (JsValueRef)0x0) {
        exitStatus = JsErrorInvalidArgument;
      }
      else {
        if ((ulong)value >> 0x30 == 0) {
          pRVar5 = Js::VarTo<Js::RecyclableObject>(value);
          pSVar2 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar2 != pSVar1) {
            exitStatus = JsErrorWrongRuntime;
            if (pSVar2->threadContext != pSVar1->threadContext) goto LAB_00361be1;
            value = Js::CrossSite::MarshalVar(pSVar1,pRVar5,false);
          }
        }
        pJVar6 = Js::JavascriptConversion::ToString(value,pSVar1);
        *result = pJVar6;
        exitStatus = JsNoError;
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          TTD::TTDJsRTActionResultAutoRecorder::SetResult(&local_38,result);
          exitStatus = JsNoError;
        }
      }
LAB_00361be1:
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)auStack_68);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_24);
    }
    this = &local_38;
    goto LAB_00361c03;
  }
  auStack_68 = (undefined1  [8])0x0;
  __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)0x0;
  pJVar4 = JsrtContext::GetCurrent();
  if (pJVar4 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_a8,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTVarToStringConversion
                (pSVar1->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_68,value);
    }
    if ((ulong)value >> 0x30 == 0) {
      pRVar5 = Js::VarTo<Js::RecyclableObject>(value);
      pSVar2 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar2 == pSVar1) goto LAB_00361a84;
      exitStatus = JsErrorWrongRuntime;
      if (pSVar2->threadContext == pSVar1->threadContext) {
        value = Js::CrossSite::MarshalVar(pSVar1,pRVar5,false);
        goto LAB_00361a84;
      }
    }
    else {
LAB_00361a84:
      *result = value;
      exitStatus = JsNoError;
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)auStack_68,result);
        exitStatus = JsNoError;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_a8);
  }
  this = (TTDJsRTActionResultAutoRecorder *)auStack_68;
LAB_00361c03:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(this,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsConvertValueToString(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    PARAM_NOT_NULL(result);
    *result = nullptr;

    if (value != nullptr && Js::VarIs<Js::JavascriptString>(value))
    {
        return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
            VALIDATE_INCOMING_REFERENCE(value, scriptContext);

            *result = value;

            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

            return JsNoError;
        });
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        *result = (JsValueRef) Js::JavascriptConversion::ToString((Js::Var)value, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}